

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__extend_receive(stbi__jpeg *j,int n)

{
  stbi__uint32 sVar1;
  uint uVar2;
  uint uVar3;
  int sgn;
  uint k;
  int n_local;
  stbi__jpeg *j_local;
  
  if (j->code_bits < n) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->code_bits < n) {
    j_local._4_4_ = 0;
  }
  else {
    sVar1 = j->code_buffer;
    uVar3 = j->code_buffer << ((byte)n & 0x1f) | j->code_buffer >> (-(byte)n & 0x1f);
    j->code_buffer = uVar3 & (stbi__bmask[n] ^ 0xffffffff);
    uVar2 = stbi__bmask[n];
    j->code_bits = j->code_bits - n;
    j_local._4_4_ = (uVar2 & uVar3) + (stbi__jbias[n] & 0xffffffffU - ((int)sVar1 >> 0x1f));
  }
  return j_local._4_4_;
}

Assistant:

stbi_inline static int stbi__extend_receive(stbi__jpeg *j, int n)
{
   unsigned int k;
   int sgn;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);
   if (j->code_bits < n) return 0; // ran out of bits from stream, return 0s intead of continuing

   sgn = j->code_buffer >> 31; // sign bit always in MSB; 0 if MSB clear (positive), 1 if MSB set (negative)
   k = stbi_lrot(j->code_buffer, n);
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k + (stbi__jbias[n] & (sgn - 1));
}